

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O2

void Qentem::Test::TestLoopTag3(QTest *test)

{
  StringStream<char> *pSVar1;
  StringStream<char> ss;
  Value<char> value;
  
  ss.storage_ = (char *)0x0;
  ss.length_ = 0;
  ss.capacity_ = 0;
  JSON::Parse<char>(&value,
                    "\n[\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 100\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 125\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2017,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 400\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2020,\n        \"quarter\": \"q1\",\n        \"week\": 1,\n        \"total\": 450\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 1,\n        \"total\": 200\n    },\n    {\n        \"year\": 2018,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    },\n    {\n        \"year\": 2019,\n        \"quarter\": \"q2\",\n        \"week\": 2,\n        \"total\": 300\n    }\n]\n    "
                   );
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\'val_1\' group=\'year111\' sort=\'descend\'><loop set=\'val_1\' value=\'val_2\'><loop set=\'val_2\' value=\'val_3\'>{var:val_3}</loop></loop></loop>"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>(test,pSVar1,(char (*) [1])0x122ce5,0xc99);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\'val_1\' group=\"year\" sort=\"descend\"><loop set=\"val_1\" value=\"val_2\"><loop set=\"val_2\" value=\"val_3\">{var:val_3}</loop></loop></loop>"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[61]>
            (test,pSVar1,
             (char (*) [61])"q11400q11450q11450q11100q11125q21200q22300q21200q22300q22300",0xca0);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" group=\'year\' sort=\"descend\"><loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\"><loop set=\"val_2\" value=\"val_3\"><loop set=\"val_3\" value=\"val_4\">{var:val_4}</loop></loop></loop></loop>"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[41]>
            (test,pSVar1,(char (*) [41])"1400145014501100112512002300120023002300",0xca6);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" group=\"year\" sort=\'descend\'>-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\" sort=\"ascend\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\" sort=\"ascend\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[102]>
            (test,pSVar1,
             (char (*) [102])
             "-- 2020-q1-1: 400 450 450-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2018-q2-1: 2002: 300-- 2017-q2-2: 300"
             ,0xcaf);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" group=\"year\">-- {var:val_1}-<loop set=\"val_1\" value=\"val_2\" group=\"quarter\">{var:val_2}-<loop set=\"val_2\" value=\"val_3\" group=\"week\">{var:val_3}:<loop set=\"val_3\" value=\"val_4\"><loop set=\"val_4\" value=\"val_5\"> {var:val_5}</loop></loop></loop></loop></loop>"
                      ,&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[102]>
            (test,pSVar1,
             (char (*) [102])
             "-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2017-q2-2: 300-- 2020-q1-1: 400 450 450-- 2018-q2-1: 2002: 300"
             ,0xcb8);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::Reset(&value);
  Value<char>::operator+=(&value,4);
  Value<char>::operator+=(&value,1);
  Value<char>::operator+=(&value,3);
  Value<char>::operator+=(&value,5);
  Value<char>::operator+=(&value,2);
  Value<char>::operator+=(&value,7);
  Value<char>::operator+=(&value,6);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" sort=\"a\">{var:val_1}</loop>",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"1234567",0xcc9);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("<loop value=\"val_1\" sort=\"d\">{var:val_1}</loop>",&value,&ss);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"7654321",0xcce);
  ss._8_8_ = ss._8_8_ & 0xffffffff00000000;
  Value<char>::~Value(&value);
  Memory::Deallocate(ss.storage_);
  return;
}

Assistant:

static void TestLoopTag3(QTest &test) {
    StringStream<char> ss;
    const char        *content;

    Value<char> value = JSON::Parse(R"(
[
    {
        "year": 2019,
        "quarter": "q1",
        "week": 1,
        "total": 100
    },
    {
        "year": 2019,
        "quarter": "q1",
        "week": 1,
        "total": 125
    },
    {
        "year": 2019,
        "quarter": "q2",
        "week": 1,
        "total": 200
    },
    {
        "year": 2017,
        "quarter": "q2",
        "week": 2,
        "total": 300
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 400
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 450
    },
    {
        "year": 2020,
        "quarter": "q1",
        "week": 1,
        "total": 450
    },
    {
        "year": 2018,
        "quarter": "q2",
        "week": 1,
        "total": 200
    },
    {
        "year": 2018,
        "quarter": "q2",
        "week": 2,
        "total": 300
    },
    {
        "year": 2019,
        "quarter": "q2",
        "week": 2,
        "total": 300
    }
]
    )");

    content =
        R"(<loop value='val_1' group='year111' sort='descend'><loop set='val_1' value='val_2'><loop set='val_2' value='val_3'>{var:val_3}</loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"()", __LINE__);
    ss.Clear();

    content =
        R"(<loop value='val_1' group="year" sort="descend"><loop set="val_1" value="val_2"><loop set="val_2" value="val_3">{var:val_3}</loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss),
                 R"(q11400q11450q11450q11100q11125q21200q22300q21200q22300q22300)", __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group='year' sort="descend"><loop set="val_1" value="val_2" group="quarter" sort="ascend"><loop set="val_2" value="val_3"><loop set="val_3" value="val_4">{var:val_4}</loop></loop></loop></loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(1400145014501100112512002300120023002300)", __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group="year" sort='descend'>-- {var:val_1}-<loop set="val_1" value="val_2" group="quarter" sort="ascend">{var:val_2}-<loop set="val_2" value="val_3" group="week" sort="ascend">{var:val_3}:<loop set="val_3" value="val_4"><loop set="val_4" value="val_5"> {var:val_5}</loop></loop></loop></loop></loop>)";

    test.IsEqual(
        Template::Render(content, value, ss),
        R"(-- 2020-q1-1: 400 450 450-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2018-q2-1: 2002: 300-- 2017-q2-2: 300)",
        __LINE__);
    ss.Clear();

    content =
        R"(<loop value="val_1" group="year">-- {var:val_1}-<loop set="val_1" value="val_2" group="quarter">{var:val_2}-<loop set="val_2" value="val_3" group="week">{var:val_3}:<loop set="val_3" value="val_4"><loop set="val_4" value="val_5"> {var:val_5}</loop></loop></loop></loop></loop>)";

    test.IsEqual(
        Template::Render(content, value, ss),
        R"(-- 2019-q1-1: 100 125q2-1: 2002: 300-- 2017-q2-2: 300-- 2020-q1-1: 400 450 450-- 2018-q2-1: 2002: 300)",
        __LINE__);
    ss.Clear();

    ////////////

    value.Reset();

    value += 4;
    value += 1;
    value += 3;
    value += 5;
    value += 2;
    value += 7;
    value += 6;

    content = R"(<loop value="val_1" sort="a">{var:val_1}</loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(1234567)", __LINE__);
    ss.Clear();

    content = R"(<loop value="val_1" sort="d">{var:val_1}</loop>)";

    test.IsEqual(Template::Render(content, value, ss), R"(7654321)", __LINE__);
    ss.Clear();
}